

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnFunctionName
          (BinaryReaderIR *this,Index index,string_view name)

{
  Module *pMVar1;
  Func *this_00;
  string_view name_00;
  string local_78;
  Index local_58;
  undefined1 local_50 [8];
  string dollar_name;
  
  name_00.size_ = (string *)name.size_;
  if (name_00.size_ != (string *)0x0) {
    pMVar1 = this->module_;
    this_00 = (pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start[index];
    name_00.data_ = (char *)name_00.size_;
    (anonymous_namespace)::MakeDollarName_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)name.data_,name_00);
    GetUniqueName((string *)local_50,(BinaryReaderIR *)&pMVar1->func_bindings,
                  (BindingHash *)&local_78,name_00.size_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)this_00,(string *)local_50);
    local_78.field_2._M_allocated_capacity._0_4_ = 0;
    local_78.field_2._4_8_ = 0;
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length._0_4_ = 0;
    local_78._M_string_length._4_4_ = 0;
    local_58 = index;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->module_->func_bindings,0,local_50);
    if (local_50 != (undefined1  [8])&dollar_name._M_string_length) {
      operator_delete((void *)local_50);
    }
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFunctionName(Index index, string_view name) {
  if (name.empty()) {
    return Result::Ok;
  }

  Func* func = module_->funcs[index];
  std::string dollar_name =
      GetUniqueName(&module_->func_bindings, MakeDollarName(name));
  func->name = dollar_name;
  module_->func_bindings.emplace(dollar_name, Binding(index));
  return Result::Ok;
}